

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

int __thiscall CVmObjGramProd::find_literal_in_alts(CVmObjGramProd *this,char *str,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  size_t *psVar8;
  long lVar9;
  bool bVar10;
  
  pcVar1 = (this->super_CVmObject).ext_;
  uVar2 = *(ulong *)(pcVar1 + 0x38);
  bVar10 = uVar2 != 0;
  if (bVar10) {
    lVar3 = *(long *)(pcVar1 + 0x30);
    uVar7 = 0;
    do {
      lVar4 = *(long *)(lVar3 + uVar7 * 8);
      bVar5 = false;
      if (*(int *)(lVar4 + 8) == 0) {
        lVar9 = *(long *)(lVar4 + 0x18);
        bVar5 = false;
        if (lVar9 != 0) {
          psVar8 = (size_t *)(*(long *)(lVar4 + 0x10) + 0x10);
          do {
            if (((*(char *)((long)psVar8 + -0xe) == '\x03') && (*psVar8 == len)) &&
               (iVar6 = bcmp((void *)psVar8[-1],str,len), iVar6 == 0)) {
              bVar5 = true;
              break;
            }
            psVar8 = psVar8 + 4;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
      }
      if (bVar5) break;
      uVar7 = uVar7 + 1;
      bVar10 = uVar7 < uVar2;
    } while (uVar7 != uVar2);
  }
  return (uint)bVar10;
}

Assistant:

int CVmObjGramProd::find_literal_in_alts(const char *str, size_t len)
{
    /* 
     *   Scan the surviving alternatives to see if this same literal token
     *   appears in any of them.  If not, it's no longer in use in the
     *   production, so delete it from the dictionary.  
     */
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
    {
        /* get this item */
        vmgram_alt_info *alt = get_ext()->alts_[i];
        
        /* if it's being deleted, skip it */
        if (alt->del)
            continue;

        /* it's still alive - scan its tokens */
        vmgram_tok_info *tok = alt->toks;
        for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
        {
            /* if this is a matching literal, the word is still in use */
            if (tok->typ == VMGRAM_MATCH_LITERAL
                && tok->typinfo.lit.len == len
                && memcmp(tok->typinfo.lit.str, str, len) == 0)
                return TRUE;
        }
    }

    /* didn't find it */
    return FALSE;
}